

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
basic_compact_json_encoder
          (basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
           *this,stream_sink<char> *sink,basic_json_encode_options<char> *options,
          allocator<char> *alloc)

{
  pointer pcVar1;
  char *pcVar2;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_compact_json_encoder_00b30798;
  pcVar1 = (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->sink_).stream_ptr_ = sink->stream_ptr_;
  (this->sink_).buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = pcVar1;
  pcVar1 = (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->sink_).buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->sink_).buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar1;
  (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (sink->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sink_).p_ = sink->p_;
  pcVar2 = sink->end_buffer_;
  (this->sink_).begin_buffer_ = sink->begin_buffer_;
  (this->sink_).end_buffer_ = pcVar2;
  basic_json_encode_options<char>::basic_json_encode_options(&this->options_,options);
  detail::write_double::write_double(&this->fp_,options->float_format_,(int)options->precision_);
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

basic_compact_json_encoder(Sink&& sink, 
            const basic_json_encode_options<CharT>& options, 
            const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)),
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc),
             nesting_depth_(0)          
        {
        }